

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_common.h
# Opt level: O2

istreambuf_iterator<char,_std::char_traits<char>_> *
date::skip_spaces<std::istreambuf_iterator<char,std::char_traits<char>>>
          (istreambuf_iterator<char,_std::char_traits<char>_> *pos,
          istreambuf_iterator<char,_std::char_traits<char>_> *end)

{
  bool bVar1;
  int_type iVar2;
  static_string<char,_7UL> spaces;
  static_string<char,_7UL> local_28;
  
  while( true ) {
    bVar1 = std::operator!=(pos,end);
    if (!bVar1) {
      return pos;
    }
    iVar2 = std::istreambuf_iterator<char,_std::char_traits<char>_>::_M_get(pos);
    builtin_strncpy(local_28.m_data._M_elems," \t\n\v\f\r",7);
    local_28._7_1_ = 0;
    local_28.m_length = 6;
    bVar1 = static_string<char,_7UL>::contains(&local_28,(value_type)iVar2);
    if (!bVar1) break;
    std::istreambuf_iterator<char,_std::char_traits<char>_>::operator++(pos);
  }
  return pos;
}

Assistant:

Iterator& skip_spaces(Iterator& pos, const Iterator& end)
{
    using char_type = typename iterator_traits<Iterator>::value_type;
    for (; pos != end; ++pos)
    {
        const char_type ch = *pos;
        constexpr auto spaces = make_static_string<char_type>(" \t\n\v\f\r");
        if (!spaces.contains(ch))
            break;
    }
    return pos;
}